

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O0

bool __thiscall OSSLDSA::signFinal(OSSLDSA *this,ByteString *signature)

{
  BIGNUM *pBVar1;
  bool bVar2;
  uchar *puVar3;
  size_t sVar4;
  ByteString *in_RSI;
  AsymmetricAlgorithm *in_RDI;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  DSA_SIG *sig;
  uint sigLen;
  DSA *dsa;
  bool bFirstResult;
  ByteString hash;
  OSSLDSAPrivateKey *pk;
  size_t in_stack_fffffffffffffed8;
  OSSLDSAPrivateKey *in_stack_fffffffffffffee0;
  BIGNUM *local_88;
  BIGNUM *local_80;
  DSA_SIG *local_78;
  uint local_6c;
  DSA *local_68;
  undefined4 local_60;
  byte local_49;
  undefined1 local_48 [40];
  PrivateKey *local_20;
  byte local_1;
  
  local_20 = in_RDI->currentPrivateKey;
  bVar2 = AsymmetricAlgorithm::signFinal(in_RDI,in_RSI);
  if (bVar2) {
    ByteString::ByteString((ByteString *)0x127546);
    local_49 = (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 0x20))
                         (in_RDI[1]._vptr_AsymmetricAlgorithm,local_48);
    local_49 = local_49 & 1;
    if (in_RDI[1]._vptr_AsymmetricAlgorithm != (_func_int **)0x0) {
      (**(code **)(*in_RDI[1]._vptr_AsymmetricAlgorithm + 8))();
    }
    in_RDI[1]._vptr_AsymmetricAlgorithm = (_func_int **)0x0;
    if ((local_49 & 1) == 0) {
      local_1 = 0;
    }
    else {
      local_68 = (DSA *)OSSLDSAPrivateKey::getOSSLKey(in_stack_fffffffffffffee0);
      local_6c = (*(local_20->super_Serialisable)._vptr_Serialisable[5])();
      ByteString::resize((ByteString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      puVar3 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      memset(puVar3,0,(ulong)local_6c);
      puVar3 = ByteString::operator[]
                         ((ByteString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      sVar4 = ByteString::size((ByteString *)0x1276b2);
      local_78 = DSA_do_sign(puVar3,(int)sVar4,local_68);
      if (local_78 == (DSA_SIG *)0x0) {
        local_1 = 0;
      }
      else {
        local_80 = (BIGNUM *)0x0;
        local_88 = (BIGNUM *)0x0;
        DSA_SIG_get0(local_78,&local_80,&local_88);
        pBVar1 = local_80;
        BN_num_bits(local_80);
        puVar3 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        BN_bn2bin(pBVar1,puVar3);
        pBVar1 = local_88;
        BN_num_bits(local_88);
        puVar3 = ByteString::operator[]
                           ((ByteString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        BN_bn2bin(pBVar1,puVar3);
        DSA_SIG_free(local_78);
        local_1 = 1;
      }
    }
    local_60 = 1;
    ByteString::~ByteString((ByteString *)0x12784d);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLDSA::signFinal(ByteString& signature)
{
	// Save necessary state before calling super class signFinal
	OSSLDSAPrivateKey* pk = (OSSLDSAPrivateKey*) currentPrivateKey;

	if (!AsymmetricAlgorithm::signFinal(signature))
	{
		return false;
	}

	ByteString hash;

	bool bFirstResult = pCurrentHash->hashFinal(hash);

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (!bFirstResult)
	{
		return false;
	}

	DSA* dsa = pk->getOSSLKey();

	// Perform the signature operation
	unsigned int sigLen = pk->getOutputLength();
	signature.resize(sigLen);
	memset(&signature[0], 0, sigLen);
	DSA_SIG* sig = DSA_do_sign(&hash[0], hash.size(), dsa);
	if (sig == NULL)
		return false;
	// Store the 2 values with padding
	const BIGNUM* bn_r = NULL;
	const BIGNUM* bn_s = NULL;
	DSA_SIG_get0(sig, &bn_r, &bn_s);
	BN_bn2bin(bn_r, &signature[sigLen / 2 - BN_num_bytes(bn_r)]);
	BN_bn2bin(bn_s, &signature[sigLen - BN_num_bytes(bn_s)]);
	DSA_SIG_free(sig);
	return true;
}